

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O2

double __thiscall
HACD::HACD::Concavity
          (HACD *this,ICHUll *ch,
          map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
          *distPoints)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  _Base_ptr p_Var4;
  Vec3<double> *normal;
  Vec3<double> *pt;
  ulong name;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  double local_40;
  undefined1 extraout_var [56];
  
  sVar1 = this->m_nPoints;
  p_Var4 = (distPoints->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = 0.0;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(distPoints->_M_t)._M_impl.super__Rb_tree_header) {
      return local_40;
    }
    if (*(char *)&p_Var4[1]._M_right == '\0') {
      name = *(ulong *)(p_Var4 + 1);
      lVar3 = name - sVar1;
      if ((long)name < (long)sVar1) {
        if ((long)name < 0) {
          pt = this->m_facePoints + ~name;
          normal = this->m_faceNormals + ~name;
        }
        else {
          pt = this->m_points + name;
          normal = this->m_normals + name;
        }
      }
      else {
        bVar2 = ICHUll::IsInside(ch,this->m_extraDistPoints + lVar3,-0.001);
        auVar5 = ZEXT816(0) << 0x40;
        if (!bVar2) goto LAB_00d8a5a4;
        name = *(ulong *)(p_Var4 + 1);
        pt = this->m_extraDistPoints + lVar3;
        normal = this->m_extraDistNormals + lVar3;
      }
      auVar6._0_8_ = ICHUll::ComputeDistance(ch,name,pt,normal,(bool *)&p_Var4[1]._M_right,true);
      auVar6._8_56_ = extraout_var;
      auVar5 = auVar6._0_16_;
    }
    else {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = p_Var4[1]._M_left;
    }
LAB_00d8a5a4:
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_40;
    auVar5 = vmaxsd_avx(auVar5,auVar7);
    local_40 = auVar5._0_8_;
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

double  HACD::Concavity(ICHUll & ch, std::map<long, DPoint> & distPoints)
    {
		double concavity = 0.0;
		double distance = 0.0;       
		std::map<long, DPoint>::iterator itDP(distPoints.begin());
		std::map<long, DPoint>::iterator itDPEnd(distPoints.end());
		long pt;
		const long nPoints = static_cast<long>(m_nPoints);
		const double eps = -0.001;
		for(; itDP != itDPEnd; ++itDP) 
		{
            if (!(itDP->second).m_computed)
            {
                if (itDP->first >= nPoints)
                {
					pt = itDP->first - nPoints;
					if ( ch.IsInside(m_extraDistPoints[pt], eps))
					{
						distance = ch.ComputeDistance(itDP->first, m_extraDistPoints[pt], m_extraDistNormals[pt], (itDP->second).m_computed, true);
					}
					else
					{
						distance = 0.0;
					}
                }
				else if (itDP->first >= 0)
                {
					pt = itDP->first;
					distance = ch.ComputeDistance(itDP->first, m_points[pt], m_normals[pt], (itDP->second).m_computed, true);
                }
                else
                {
					pt = -itDP->first-1;
					distance = ch.ComputeDistance(itDP->first, m_facePoints[pt], m_faceNormals[pt], (itDP->second).m_computed, true);
				}
            }
            else
            {
                distance = (itDP->second).m_dist;
            }

			if (concavity < distance) 
			{
				concavity = distance;
			}
		}
		return concavity;
    }